

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_color_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMeshVertexColorQuantity::VolumeMeshVertexColorQuantity
          (VolumeMeshVertexColorQuantity *this,string *name,VolumeMesh *mesh_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *values_)

{
  string *in_RSI;
  undefined8 *in_RDI;
  VolumeMesh *this_00;
  undefined1 local_61 [17];
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  VolumeMesh *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  VolumeMeshColorQuantity *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,in_RSI);
  this_00 = (VolumeMesh *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"vertex",(allocator *)this_00);
  VolumeMeshColorQuantity::VolumeMeshColorQuantity
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  *in_RDI = &PTR__VolumeMeshVertexColorQuantity_0098eb20;
  VolumeMesh::refreshVolumeMeshListeners(this_00);
  return;
}

Assistant:

VolumeMeshVertexColorQuantity::VolumeMeshVertexColorQuantity(std::string name, VolumeMesh& mesh_,
                                                             const std::vector<glm::vec3>& values_)
    : VolumeMeshColorQuantity(name, mesh_, "vertex", values_)

{
  parent.refreshVolumeMeshListeners(); // just in case this quantity is being drawn
}